

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::Arg(Arg *this,Arg *param_1)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((param_1->boundField).functionObj)->_vptr_IArgFunction[5])();
  (this->boundField).functionObj = (IArgFunction<Catch::ConfigData> *)CONCAT44(extraout_var,iVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->shortNames,&param_1->shortNames);
  std::__cxx11::string::string((string *)&this->longName,(string *)&param_1->longName);
  std::__cxx11::string::string((string *)&this->description,(string *)&param_1->description);
  std::__cxx11::string::string((string *)&this->hint,(string *)&param_1->hint);
  this->position = param_1->position;
  return;
}

Assistant:

Arg( Detail::BoundArgFunction<ConfigT> const& _boundField ) : boundField( _boundField ), position( -1 ) {}